

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

QStringList * QtPrivate::QStringList_filter(QStringList *that,QStringView str,CaseSensitivity cs)

{
  long lVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *in_stack_00000018;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  filter_helper<QStringView>(in_stack_00000018,(QStringView *)that,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList *that, QStringView str,
                                          Qt::CaseSensitivity cs)
{
    return filter_helper(*that, str, cs);
}